

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

SQString * __thiscall SQVM::PrintObjVal(SQVM *this,SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQSharedState *pSVar2;
  SQChar *pSVar3;
  SQObjectPtr *o_local;
  SQVM *this_local;
  
  SVar1 = (o->super_SQObject)._type;
  if (SVar1 == OT_INTEGER) {
    pSVar3 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
    snprintf(pSVar3,0x32,"%lld",(o->super_SQObject)._unVal.pTable);
    pSVar2 = this->_sharedstate;
    pSVar3 = SQSharedState::GetScratchPad(this->_sharedstate,-1);
    this_local = (SQVM *)SQString::Create(pSVar2,pSVar3,-1);
  }
  else if (SVar1 == OT_FLOAT) {
    pSVar3 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
    snprintf(pSVar3,0x32,"%.14g",(double)(o->super_SQObject)._unVal.fFloat);
    pSVar2 = this->_sharedstate;
    pSVar3 = SQSharedState::GetScratchPad(this->_sharedstate,-1);
    this_local = (SQVM *)SQString::Create(pSVar2,pSVar3,-1);
  }
  else if (SVar1 == OT_STRING) {
    this_local = (o->super_SQObject)._unVal.pThread;
  }
  else {
    pSVar2 = this->_sharedstate;
    pSVar3 = GetTypeName(o);
    this_local = (SQVM *)SQString::Create(pSVar2,pSVar3,-1);
  }
  return (SQString *)this_local;
}

Assistant:

SQString *SQVM::PrintObjVal(const SQObjectPtr &o)
{
    switch(sq_type(o)) {
    case OT_STRING: return _string(o);
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR), _PRINT_INT_FMT, _integer(o));
        return SQString::Create(_ss(this), _spval);
        break;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)), sq_rsl(NUMBER_MAX_CHAR), _SC("%.14g"), _float(o));
        return SQString::Create(_ss(this), _spval);
        break;
    default:
        return SQString::Create(_ss(this), GetTypeName(o));
    }
}